

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QSpinBoxPrivate::QSpinBoxPrivate(QSpinBoxPrivate *this)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff70;
  QVariant *this_00;
  QVariant *this_01;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__QSpinBoxPrivate_00d1b368;
  ::QVariant::QVariant(&local_28,0);
  this_01 = (QVariant *)(in_RDI + 0x58);
  ::QVariant::operator=(this_01,(QVariant *)in_stack_ffffffffffffff70);
  ::QVariant::~QVariant(&local_28);
  this_00 = &local_48;
  ::QVariant::QVariant(this_00,99);
  ::QVariant::operator=(this_01,this_00);
  ::QVariant::~QVariant(this_00);
  ::QVariant::operator=((QVariant *)(in_RDI + 0x54),(QVariant *)this_01);
  *(undefined4 *)((long)in_RDI + 0x3d4) = 10;
  ::QVariant::QVariant(&local_68,1);
  ::QVariant::operator=(this_01,this_00);
  ::QVariant::~QVariant(&local_68);
  *(undefined4 *)(in_RDI + 0x71) = 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSpinBoxPrivate::QSpinBoxPrivate()
{
    minimum = QVariant((int)0);
    maximum = QVariant((int)99);
    value = minimum;
    displayIntegerBase = 10;
    singleStep = QVariant((int)1);
    type = QMetaType::Int;
}